

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

uint * getRevealedNodes(tree_t *tree,uint16_t *hideList,size_t hideListSize,size_t *outputSize)

{
  ushort uVar1;
  uint uVar2;
  bitset_word_t *pbVar3;
  undefined1 auVar4 [16];
  size_t len4;
  void *__ptr;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t i;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  void *pvVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  
  uVar14 = (ulong)(tree->depth - 1);
  __ptr = calloc(uVar14 * hideListSize,4);
  if (hideListSize == 0) {
    uVar17 = tree->numLeaves;
  }
  else {
    uVar17 = tree->numLeaves;
    sVar9 = 0;
    iVar6 = tree->numNodes - uVar17;
    do {
      uVar1 = hideList[sVar9];
      *(uint *)((long)__ptr + sVar9 * 4) = iVar6 + (uint)uVar1;
      uVar11 = iVar6 + 1 + (uint)uVar1 >> 1;
      iVar16 = uVar11 - 1;
      if (iVar16 != 0) {
        uVar18 = 1;
        do {
          lVar20 = uVar18 * hideListSize;
          uVar11 = uVar11 >> 1;
          uVar18 = (ulong)((int)uVar18 + 1);
          *(int *)((long)__ptr + lVar20 * 4 + sVar9 * 4) = iVar16;
          iVar16 = uVar11 - 1;
        } while (iVar16 != 0);
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != hideListSize);
  }
  puVar5 = (uint *)malloc((ulong)uVar17 << 2);
  sVar9 = 0;
  if (uVar14 != 0) {
    uVar18 = hideListSize & 0xfffffffffffffffc;
    uVar19 = 0;
    uVar17 = 0;
    pvVar15 = __ptr;
    do {
      if (hideListSize != 0) {
        uVar11 = tree->numNodes;
        sVar9 = 0;
        do {
          uVar2 = *(uint *)((long)__ptr + sVar9 * 4 + uVar19 * hideListSize * 4);
          if ((uVar2 < uVar11) &&
             (pbVar3 = tree->haveNodeExists,
             (pbVar3[uVar2 * 2 >> 6] >> ((ulong)(uVar2 * 2) & 0x3f) & 1) != 0)) {
            if ((uVar2 & 1) == 0) {
              uVar12 = uVar2 | 1;
            }
            else {
              uVar12 = uVar2 + 1;
              if ((uVar11 <= uVar12) || ((pbVar3[uVar12 * 2 >> 6] >> (uVar12 * 2 & 0x3c) & 1) == 0))
              goto LAB_0012143b;
            }
            if (uVar11 <= uVar12) {
              uVar12 = 0;
            }
            if ((uVar2 & 1) == 0) {
              uVar12 = uVar2 - 1;
            }
            if (uVar18 == 0) {
              uVar8 = 0;
            }
            else {
              auVar21 = vpbroadcastd_avx512vl();
              uVar7 = 0;
              do {
                auVar4 = vpcmpeqd_avx(auVar21,*(undefined1 (*) [16])((long)pvVar15 + uVar7 * 4));
                if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar4[0xf] < '\0') goto LAB_0012143b;
                uVar7 = uVar7 + 4;
                uVar8 = uVar18;
              } while (uVar7 < uVar18);
            }
            if (uVar8 < hideListSize) {
              do {
                if (*(uint *)((long)pvVar15 + uVar8 * 4) == uVar12) goto LAB_0012143b;
                uVar8 = uVar8 + 1;
              } while (hideListSize != uVar8);
            }
            do {
              uVar13 = uVar12;
              uVar2 = uVar13 * 2;
              if ((uVar13 < uVar11 && uVar13 * 2 + 2 < uVar11) &&
                 ((pbVar3[uVar2 >> 6] >> (uVar2 & 0x3e) & 1) != 0)) break;
              uVar12 = uVar2 | 1;
            } while ((uVar2 | 1) < uVar11);
            uVar7 = (ulong)uVar17;
            uVar8 = uVar7 & 0xfffffffc;
            if ((uVar17 & 0xfffffffc) == 0) {
              uVar8 = 0;
            }
            else {
              auVar21 = vpbroadcastd_avx512vl();
              uVar10 = 0;
              do {
                auVar4 = vpcmpeqd_avx(auVar21,*(undefined1 (*) [16])(puVar5 + uVar10));
                if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar4[0xf] < '\0') goto LAB_0012143b;
                uVar10 = uVar10 + 4;
              } while (uVar10 < uVar8);
            }
            if (uVar8 < uVar7) {
              do {
                if (puVar5[uVar8] == uVar13) goto LAB_0012143b;
                uVar8 = uVar8 + 1;
              } while (uVar7 != uVar8);
            }
            puVar5[uVar7] = uVar13;
            uVar17 = uVar17 + 1;
          }
LAB_0012143b:
          sVar9 = sVar9 + 1;
        } while (sVar9 != hideListSize);
      }
      pvVar15 = (void *)((long)pvVar15 + hideListSize * 4);
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar14);
    sVar9 = (size_t)uVar17;
  }
  free(__ptr);
  *outputSize = sVar9;
  return puVar5;
}

Assistant:

static unsigned int* getRevealedNodes(tree_t* tree, uint16_t* hideList, size_t hideListSize,
                                      size_t* outputSize) {
  /* Compute paths up from hideList to root, store as sets of nodes */
  const unsigned int pathLen = tree->depth - 1;

  /* pathSets[i][0...hideListSize] ~= pathSets[i * hideListSize + ...] stores the nodes in the path
   * at depth i for each of the leaf nodes in hideListSize */
  unsigned int* pathSets = calloc(hideListSize * pathLen, sizeof(unsigned int));

  /* Compute the paths back to the root */
  for (size_t i = 0; i < hideListSize; i++) {
    /* input lists leaf indexes, translate to nodes */
    unsigned int node                    = hideList[i] + (tree->numNodes - tree->numLeaves);
    pathSets[/* 0 * hideListSize + */ i] = node;
    unsigned int pos                     = 1;
    while ((node = getParent(node)) != 0) {
      pathSets[pos * hideListSize + i] = node;
      pos++;
    }
  }

  /* Determine seeds to reveal */
  unsigned int* revealed   = malloc(tree->numLeaves * sizeof(unsigned int));
  unsigned int revealedPos = 0;
  for (unsigned int d = 0; d < pathLen; d++) {
    for (size_t i = 0; i < hideListSize; i++) {
      unsigned int node = pathSets[d * hideListSize + i];
      if (!hasSibling(tree, node)) {
        continue;
      }
      unsigned int sibling = getSibling(tree, node);
      if (!contains(&pathSets[d * hideListSize], hideListSize, sibling)) {
        // Determine the seed to reveal
        while (!hasRightChild(tree, sibling) && !isLeafNode(tree, sibling)) {
          sibling = 2 * sibling + 1; // sibling = leftChild(sibling)
        }
        // Only reveal if we haven't already
        if (!contains(revealed, revealedPos, sibling)) {
          revealed[revealedPos] = sibling;
          revealedPos++;
        }
      }
    }
  }

  free(pathSets);

  *outputSize = revealedPos;
  return revealed;
}